

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghsymbol.cc
# Opt level: O2

int4 __thiscall DecisionNode::getNumFixed(DecisionNode *this,int4 low,int4 size,bool context)

{
  pointer ppVar1;
  uintm uVar2;
  int4 i;
  ulong uVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  
  lVar4 = 0;
  uVar6 = -1 << ((byte)size & 0x1f);
  if (size == 0x20) {
    uVar6 = 0;
  }
  iVar5 = 0;
  for (uVar3 = 0;
      ppVar1 = (this->list).
               super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(this->list).
                            super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1 >> 4);
      uVar3 = uVar3 + 1) {
    uVar2 = DisjointPattern::getMask
                      (*(DisjointPattern **)((long)&ppVar1->first + lVar4),low,size,context);
    iVar5 = iVar5 + (uint)((uVar2 | uVar6) == 0xffffffff);
    lVar4 = lVar4 + 0x10;
  }
  return iVar5;
}

Assistant:

int4 DecisionNode::getNumFixed(int4 low,int4 size,bool context)

{				// Get number of patterns that specify this field
  int4 count = 0;
  uintm mask;
				// Bits which must be specified in the mask
  uintm m = (size==8*sizeof(uintm)) ? 0 : (((uintm)1)<<size);
  m = m-1;

  for(int4 i=0;i<list.size();++i) {
    mask = list[i].first->getMask(low,size,context);
    if ((mask&m)==m)
      count += 1;
  }
  return count;
}